

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSiteNameCommand.cxx
# Opt level: O2

bool cmSiteNameCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  string *name;
  bool bVar2;
  cmValue cVar3;
  long lVar4;
  string_view value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string host;
  string hostname_cmd;
  string siteName;
  string hostRegExp;
  string local_270;
  RegularExpression hostReg;
  
  lVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 == 0x20) {
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    paths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (char (*) [9])"/usr/bsd");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[10]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (char (*) [10])"/usr/sbin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[9]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (char (*) [9])"/usr/bin");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[5]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (char (*) [5])0x6edbc9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[6]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (char (*) [6])0x71a386);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[15]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&paths,
               (char (*) [15])"/usr/local/bin");
    cVar3 = cmMakefile::GetDefinition
                      (status->Makefile,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (cVar3.Value == (string *)0x0) {
      pcVar1 = status->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hostReg,"HOSTNAME",(allocator<char> *)&hostname_cmd);
      cVar3 = cmMakefile::GetDefinition(pcVar1,(string *)&hostReg);
      std::__cxx11::string::~string((string *)&hostReg);
      hostname_cmd._M_dataplus._M_p = (pointer)&hostname_cmd.field_2;
      hostname_cmd._M_string_length = 0;
      hostname_cmd.field_2._M_local_buf[0] = '\0';
      if (cVar3.Value == (string *)0x0) {
        cmsys::SystemTools::FindProgram((string *)&hostReg,"hostname",&paths,false);
        std::__cxx11::string::operator=((string *)&hostname_cmd,(string *)&hostReg);
        std::__cxx11::string::~string((string *)&hostReg);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&hostname_cmd);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&siteName,"unknown",(allocator<char> *)&hostReg);
      value._M_str = hostname_cmd._M_dataplus._M_p;
      value._M_len = hostname_cmd._M_string_length;
      bVar2 = cmValue::IsOff(value);
      if (!bVar2) {
        host._M_dataplus._M_p = (pointer)&host.field_2;
        host._M_string_length = 0;
        host.field_2._M_local_buf[0] = '\0';
        cmSystemTools::RunSingleCommand
                  (&hostname_cmd,&host,(string *)0x0,(int *)0x0,(char *)0x0,OUTPUT_NONE,
                   (cmDuration)0x0);
        if (host._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hostRegExp,"[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*",
                     (allocator<char> *)&hostReg);
          cmsys::RegularExpression::RegularExpression(&hostReg,hostRegExp._M_dataplus._M_p);
          bVar2 = cmsys::RegularExpression::find(&hostReg,host._M_dataplus._M_p);
          if (bVar2) {
            cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_270,&hostReg.regmatch,1);
            std::__cxx11::string::operator=((string *)&host,(string *)&local_270);
            std::__cxx11::string::~string((string *)&local_270);
          }
          if (host._M_string_length != 0) {
            std::__cxx11::string::_M_assign((string *)&siteName);
          }
          cmsys::RegularExpression::~RegularExpression(&hostReg);
          std::__cxx11::string::~string((string *)&hostRegExp);
        }
        std::__cxx11::string::~string((string *)&host);
      }
      pcVar1 = status->Makefile;
      name = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hostReg,"Name of the computer/site where compile is being run",
                 (allocator<char> *)&host);
      cmMakefile::AddCacheDefinition(pcVar1,name,&siteName,(string *)&hostReg,STRING,false);
      std::__cxx11::string::~string((string *)&hostReg);
      std::__cxx11::string::~string((string *)&siteName);
      std::__cxx11::string::~string((string *)&hostname_cmd);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&paths);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&hostReg,"called with incorrect number of arguments",
               (allocator<char> *)&hostname_cmd);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&hostReg);
  }
  return lVar4 == 0x20;
}

Assistant:

bool cmSiteNameCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 1) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  std::vector<std::string> paths;
  paths.emplace_back("/usr/bsd");
  paths.emplace_back("/usr/sbin");
  paths.emplace_back("/usr/bin");
  paths.emplace_back("/bin");
  paths.emplace_back("/sbin");
  paths.emplace_back("/usr/local/bin");

  cmValue cacheValue = status.GetMakefile().GetDefinition(args[0]);
  if (cacheValue) {
    return true;
  }

  cmValue temp = status.GetMakefile().GetDefinition("HOSTNAME");
  std::string hostname_cmd;
  if (temp) {
    hostname_cmd = *temp;
  } else {
    hostname_cmd = cmSystemTools::FindProgram("hostname", paths);
  }

  std::string siteName = "unknown";
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string host;
  if (cmSystemTools::ReadRegistryValue(
        "HKEY_LOCAL_MACHINE\\System\\CurrentControlSet\\"
        "Control\\ComputerName\\ComputerName;ComputerName",
        host)) {
    siteName = host;
  }
#else
  // try to find the hostname for this computer
  if (!cmIsOff(hostname_cmd)) {
    std::string host;
    cmSystemTools::RunSingleCommand(hostname_cmd, &host, nullptr, nullptr,
                                    nullptr, cmSystemTools::OUTPUT_NONE);

    // got the hostname
    if (!host.empty()) {
      // remove any white space from the host name
      std::string hostRegExp = "[ \t\n\r]*([^\t\n\r ]*)[ \t\n\r]*";
      cmsys::RegularExpression hostReg(hostRegExp.c_str());
      if (hostReg.find(host.c_str())) {
        // strip whitespace
        host = hostReg.match(1);
      }

      if (!host.empty()) {
        siteName = host;
      }
    }
  }
#endif
  status.GetMakefile().AddCacheDefinition(
    args[0], siteName, "Name of the computer/site where compile is being run",
    cmStateEnums::STRING);

  return true;
}